

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

BOOL Js::JavascriptLibrary::IsFltFunc(BuiltinFunction index)

{
  BOOL BVar1;
  BuiltInFlags flags;
  BuiltInArgSpecializationType BVar2;
  bool isFloatFunc;
  BuiltInArgSpecializationType dstType;
  BuiltInFlags builtInFlags;
  BuiltinFunction index_local;
  
  BVar1 = CanFloatPreferenceFunc(index);
  if (BVar1 == 0) {
    builtInFlags = BIF_None;
  }
  else {
    flags = GetFlagsForBuiltIn(index);
    BVar2 = GetBuiltInArgType(flags,BIAS_Dst);
    builtInFlags = (BuiltInFlags)(BVar2 == BIAST_Float);
  }
  return builtInFlags;
}

Assistant:

BOOL JavascriptLibrary::IsFltFunc(BuiltinFunction index)
    {
        // Note: MathFunction is one of built-ins.
        if (!JavascriptLibrary::CanFloatPreferenceFunc(index))
        {
            return FALSE;
        }

        Js::BuiltInFlags builtInFlags = JavascriptLibrary::GetFlagsForBuiltIn(index);
        Js::BuiltInArgSpecializationType dstType = Js::JavascriptLibrary::GetBuiltInArgType(builtInFlags, Js::BuiltInArgShift::BIAS_Dst);
        bool isFloatFunc = dstType == Js::BuiltInArgSpecializationType::BIAST_Float;
        return isFloatFunc;
    }